

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

uint32_t array_container_rank_many
                   (array_container_t *arr,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  undefined4 uVar1;
  int32_t iVar2;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  long in_RSI;
  int *in_RDI;
  long *in_R8;
  _Bool is_present;
  int32_t idx;
  uint16_t xhigh;
  uint32_t x;
  uint32_t *iter;
  uint32_t pos;
  uint16_t high;
  undefined4 *local_40;
  uint local_38;
  long *local_30;
  
  uVar1 = *in_RDX;
  local_38 = 0;
  local_40 = in_RDX;
  local_30 = in_R8;
  while( true ) {
    if (local_40 == in_RCX) {
      return (uint32_t)((long)local_40 - (long)in_RDX >> 2);
    }
    if ((short)((uint)*local_40 >> 0x10) != (short)((uint)uVar1 >> 0x10)) break;
    iVar2 = binarySearch((uint16_t *)(*(long *)(in_RDI + 2) + (ulong)local_38 * 2),
                         *in_RDI - local_38,(uint16_t)*local_40);
    if (iVar2 < 0) {
      *local_30 = in_RSI + (ulong)local_38 + (long)(-1 - iVar2);
    }
    else {
      *local_30 = in_RSI + (ulong)local_38 + (long)(iVar2 + 1);
      local_38 = iVar2 + 1;
    }
    local_30 = local_30 + 1;
    local_40 = local_40 + 1;
  }
  return (uint32_t)((long)local_40 - (long)in_RDX >> 2);
}

Assistant:

inline uint32_t array_container_rank_many(const array_container_t *arr,
                                          uint64_t start_rank,
                                          const uint32_t *begin,
                                          const uint32_t *end, uint64_t *ans) {
    const uint16_t high = (uint16_t)((*begin) >> 16);
    uint32_t pos = 0;
    const uint32_t *iter = begin;
    for (; iter != end; iter++) {
        uint32_t x = *iter;
        uint16_t xhigh = (uint16_t)(x >> 16);
        if (xhigh != high) return iter - begin;  // stop at next container

        const int32_t idx =
            binarySearch(arr->array + pos, arr->cardinality - pos, (uint16_t)x);
        const bool is_present = idx >= 0;
        if (is_present) {
            *(ans++) = start_rank + pos + (idx + 1);
            pos = idx + 1;
        } else {
            *(ans++) = start_rank + pos + (-idx - 1);
        }
    }
    return iter - begin;
}